

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestExpectMacroInternal::Run(TestExpectMacroInternal *this)

{
  Outputter *pOVar1;
  bool bVar2;
  Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_> *pCVar3;
  bool *pbVar4;
  bool *tail;
  bool *tail_00;
  char (*s) [104];
  stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_219;
  char *local_218;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_210;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>_>
  local_1e0;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>_>
  local_1a8;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  local_168;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_120;
  testinator local_d0 [39];
  stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_a9;
  int local_a8;
  undefined1 local_a1 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_98;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_90;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>_> local_78;
  undefined1 local_58 [8];
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  diag;
  Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool_&>_>
  *local_28;
  Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool_&>_>
  cap;
  bool fail;
  TestExpectMacroInternal *this_local;
  
  cap.m_list.m_pair.second._7_1_ = 1;
  memset(&diag.m_list.field_0x25,0,1);
  diag.m_list._36_1_ = (cap.m_list.m_pair.second._7_1_ ^ 0xff) & 1;
  pCVar3 = testinator::operator->*
                     ((Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_>
                       *)&diag.m_list.field_0x25,
                      (Capture<testinator::Nothing> *)&diag.m_list.field_0x24,tail);
  diag.m_list._38_2_ = SUB82(pCVar3,0);
  local_28 = testinator::operator==
                       ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool_&>_>
                         *)&diag.m_list.field_0x26,
                        (Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>_>
                         *)((long)&cap.m_list.m_pair.second + 7),tail_00);
  bVar2 = testinator::
          Eval<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>,testinator::EQOp,bool&>>&>
                    ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool_&>_>
                      *)&local_28);
  if (!bVar2) {
    local_a1[0] = 0;
    local_98 = testinator::operator<<
                         ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_a1,
                          (Cons<testinator::Nil> *)
                          "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
                          ,s);
    local_a8 = 0xb8;
    testinator::operator<<
              (&local_90,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_a1 + 1),&local_a8
              );
    testinator::operator<<(&local_78,&local_90,(char (*) [20])" (!fail == fail => ");
    pbVar4 = testinator::
             LHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>,testinator::EQOp,bool&>>&>
                       ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool_&>_>
                         *)&local_28);
    local_a9.m_t = (bool)testinator::prettyprint<bool>(pbVar4);
    testinator::operator<<
              ((Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_58,&local_78,&local_a9);
    pOVar1 = (this->super_Test).m_op;
    testinator::operator<<
              (&local_210,
               (Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_58,(char (*) [2])0x274595);
    local_218 = testinator::
                RelOp<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>,testinator::EQOp,bool&>>&>
                          ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool_&>_>
                            *)&local_28);
    testinator::operator<<(&local_1e0,&local_210,&local_218);
    testinator::operator<<(&local_1a8,&local_1e0,(char (*) [2])0x274595);
    pbVar4 = testinator::
             RHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,bool>,testinator::EQOp,bool&>>&>
                       ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_bool>,_testinator::EQOp,_bool_&>_>
                         *)&local_28);
    local_219.m_t = (bool)testinator::prettyprint<bool&>(pbVar4);
    testinator::operator<<(&local_168,&local_1a8,&local_219);
    testinator::operator<<(&local_120,&local_168,(char (*) [2])0x275bda);
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
              (local_d0,&local_120);
    (*pOVar1->_vptr_Outputter[3])(pOVar1,local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    (this->super_Test).m_success = false;
  }
  return true;
}

Assistant:

virtual bool Run()
  {
    bool fail = true;
    EXPECT(!fail == fail);
    return true;
  }